

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void DC8uvMode_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  uint8_t v;
  undefined1 auVar1 [16];
  
  if (top == (uint8_t *)0x0) {
    if (left != (uint8_t *)0x0) {
      DC8uvNoLeft_SSE2(dst,left);
      return;
    }
    v = 0x80;
  }
  else {
    if (left == (uint8_t *)0x0) {
      DC8uvNoLeft_SSE2(dst,top);
      return;
    }
    auVar1._8_8_ = *(undefined8 *)left;
    auVar1._0_8_ = *(undefined8 *)top;
    auVar1 = psadbw((undefined1  [16])0x0,auVar1);
    v = (uint8_t)(auVar1._8_4_ + auVar1._0_4_ + 8U >> 4);
  }
  Put8x8uv_SSE2(v,dst);
  return;
}

Assistant:

static WEBP_INLINE void DC8uvMode_SSE2(uint8_t* WEBP_RESTRICT dst,
                                       const uint8_t* WEBP_RESTRICT left,
                                       const uint8_t* WEBP_RESTRICT top) {
  if (top != NULL) {
    if (left != NULL) {  // top and left present
      DC8uv_SSE2(dst, left, top);
    } else {  // top, but no left
      DC8uvNoLeft_SSE2(dst, top);
    }
  } else if (left != NULL) {  // left but no top
    DC8uvNoTop_SSE2(dst, left);
  } else {  // no top, no left, nothing.
    DC8uvNoTopLeft_SSE2(dst);
  }
}